

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O0

void tf::detail::
     parallel_pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,true>
               (undefined8 param_1,int *param_2,undefined8 param_3,int param_4,byte param_5)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_02;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_03;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_04;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_05;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_06;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_07;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_08;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_09;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_10;
  bool bVar1;
  reference __y;
  ulong uVar2;
  ulong uVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  bool bVar5;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pVar6;
  bool highly_unbalanced;
  size_t r_size;
  size_t l_size;
  bool already_partitioned;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> pivot_pos;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pair;
  size_t s2;
  size_t size;
  int ninther_threshold;
  int insertion_sort_threshold;
  size_t cutoff;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffc78;
  undefined7 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc87;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_fffffffffffffc88;
  byte local_369;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_148 [2];
  int *local_138;
  int *local_130;
  int *local_128;
  int *local_120;
  int *local_118;
  int *local_108;
  int *local_100;
  int *local_f8;
  int *local_e8;
  int *local_e0;
  int *local_d8;
  int *local_c8;
  int *local_c0;
  int *local_b8;
  int *local_a8;
  int *local_a0;
  int *local_98;
  ulong local_90;
  undefined8 local_80;
  int *local_78;
  undefined8 local_68;
  int *local_60;
  undefined8 local_50;
  int *local_48;
  ulong local_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined8 local_30;
  byte local_25;
  int local_24;
  undefined8 local_20;
  less<int> local_11;
  undefined8 local_10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_8;
  
  local_25 = param_5 & 1;
  local_30 = 0x1000;
  local_34 = 0x18;
  local_38 = 0x80;
  local_24 = param_4;
  local_20 = param_1;
  local_10 = param_3;
  local_8._M_current = param_2;
  while( true ) {
    local_40 = __gnu_cxx::operator-
                         ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                          CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                          in_stack_fffffffffffffc78._M_current);
    if (local_40 < 0x18) {
      if ((local_25 & 1) == 0) {
        local_60 = local_8._M_current;
        local_68 = local_10;
        unguarded_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                  (local_8._M_current,local_10);
      }
      else {
        local_48 = local_8._M_current;
        local_50 = local_10;
        insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                  (local_8._M_current,local_10);
      }
      return;
    }
    if (local_40 < 0x1001) break;
    local_90 = local_40 >> 1;
    if (local_40 < 0x81) {
      local_128 = (int *)__gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator+(in_stack_fffffffffffffc88,
                                   CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
      local_130 = local_8._M_current;
      local_138 = (int *)__gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator-(in_stack_fffffffffffffc88,
                                   CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                (local_128,local_130,local_138);
    }
    else {
      local_98 = local_8._M_current;
      local_a0 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator+(in_stack_fffffffffffffc88,
                                    CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
      local_a8 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator-(in_stack_fffffffffffffc88,
                                    CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                (local_98,local_a0,local_a8);
      local_b8 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator+(in_stack_fffffffffffffc88,
                                    CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
      local_c0 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator+(in_stack_fffffffffffffc88,
                                    CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
      local_c8 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator-(in_stack_fffffffffffffc88,
                                    CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                (local_b8,local_c0,local_c8);
      local_d8 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator+(in_stack_fffffffffffffc88,
                                    CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
      local_e0 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator+(in_stack_fffffffffffffc88,
                                    CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
      local_e8 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator-(in_stack_fffffffffffffc88,
                                    CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                (local_d8,local_e0,local_e8);
      local_f8 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator+(in_stack_fffffffffffffc88,
                                    CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
      local_100 = (int *)__gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator+(in_stack_fffffffffffffc88,
                                   CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
      local_108 = (int *)__gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator+(in_stack_fffffffffffffc88,
                                   CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                (local_f8,local_100,local_108);
      local_118 = local_8._M_current;
      local_120 = (int *)__gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator+(in_stack_fffffffffffffc88,
                                   CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
      _Var4._M_current._7_1_ = in_stack_fffffffffffffc87;
      _Var4._M_current._0_7_ = in_stack_fffffffffffffc80;
      std::
      iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (_Var4,in_stack_fffffffffffffc78);
    }
    local_369 = 0;
    if ((local_25 & 1) == 0) {
      local_148[0] = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator-(in_stack_fffffffffffffc88,
                               CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
      in_stack_fffffffffffffc88 =
           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
           __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (local_148);
      __y = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                      (&local_8);
      bVar1 = std::less<int>::operator()(&local_11,(int *)in_stack_fffffffffffffc88,__y);
      local_369 = bVar1 ^ 0xff;
    }
    if ((local_369 & 1) == 0) {
      pVar6 = partition_right_branchless<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                        (local_8._M_current,local_10);
      uVar2 = __gnu_cxx::operator-
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffc78._M_current);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                (in_stack_fffffffffffffc88,
                 CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
      uVar3 = __gnu_cxx::operator-
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffc78._M_current);
      bVar1 = uVar2 < local_40 >> 3;
      bVar5 = uVar3 < local_40 >> 3;
      in_stack_fffffffffffffc87 = bVar1 || bVar5;
      if (bVar1 || bVar5) {
        local_24 = local_24 + -1;
        if (local_24 == 0) {
          std::
          make_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                    (local_8._M_current,local_10);
          std::
          sort_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                    (local_8._M_current,local_10);
          return;
        }
        if (0x17 < uVar2) {
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (in_stack_fffffffffffffc88,
                     CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
          __a._M_current._7_1_ = in_stack_fffffffffffffc87;
          __a._M_current._0_7_ = in_stack_fffffffffffffc80;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (__a,in_stack_fffffffffffffc78);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                    (in_stack_fffffffffffffc88,
                     CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                    (in_stack_fffffffffffffc88,
                     CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
          __a_00._M_current._7_1_ = in_stack_fffffffffffffc87;
          __a_00._M_current._0_7_ = in_stack_fffffffffffffc80;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (__a_00,in_stack_fffffffffffffc78);
          if (0x80 < uVar2) {
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                      (in_stack_fffffffffffffc88,
                       CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                      (in_stack_fffffffffffffc88,
                       CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
            __a_01._M_current._7_1_ = in_stack_fffffffffffffc87;
            __a_01._M_current._0_7_ = in_stack_fffffffffffffc80;
            std::
            iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                      (__a_01,in_stack_fffffffffffffc78);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                      (in_stack_fffffffffffffc88,
                       CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                      (in_stack_fffffffffffffc88,
                       CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
            __a_02._M_current._7_1_ = in_stack_fffffffffffffc87;
            __a_02._M_current._0_7_ = in_stack_fffffffffffffc80;
            std::
            iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                      (__a_02,in_stack_fffffffffffffc78);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                      (in_stack_fffffffffffffc88,
                       CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                      (in_stack_fffffffffffffc88,
                       CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
            __a_03._M_current._7_1_ = in_stack_fffffffffffffc87;
            __a_03._M_current._0_7_ = in_stack_fffffffffffffc80;
            std::
            iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                      (__a_03,in_stack_fffffffffffffc78);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                      (in_stack_fffffffffffffc88,
                       CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                      (in_stack_fffffffffffffc88,
                       CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
            __a_04._M_current._7_1_ = in_stack_fffffffffffffc87;
            __a_04._M_current._0_7_ = in_stack_fffffffffffffc80;
            std::
            iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                      (__a_04,in_stack_fffffffffffffc78);
          }
        }
        if (0x17 < uVar3) {
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (in_stack_fffffffffffffc88,
                     CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (in_stack_fffffffffffffc88,
                     CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
          __a_05._M_current._7_1_ = in_stack_fffffffffffffc87;
          __a_05._M_current._0_7_ = in_stack_fffffffffffffc80;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (__a_05,in_stack_fffffffffffffc78);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                    (in_stack_fffffffffffffc88,
                     CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                    (in_stack_fffffffffffffc88,
                     CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
          __a_06._M_current._7_1_ = in_stack_fffffffffffffc87;
          __a_06._M_current._0_7_ = in_stack_fffffffffffffc80;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (__a_06,in_stack_fffffffffffffc78);
          if (0x80 < uVar3) {
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                      (in_stack_fffffffffffffc88,
                       CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                      (in_stack_fffffffffffffc88,
                       CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
            __a_07._M_current._7_1_ = in_stack_fffffffffffffc87;
            __a_07._M_current._0_7_ = in_stack_fffffffffffffc80;
            std::
            iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                      (__a_07,in_stack_fffffffffffffc78);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                      (in_stack_fffffffffffffc88,
                       CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                      (in_stack_fffffffffffffc88,
                       CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
            __a_08._M_current._7_1_ = in_stack_fffffffffffffc87;
            __a_08._M_current._0_7_ = in_stack_fffffffffffffc80;
            std::
            iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                      (__a_08,in_stack_fffffffffffffc78);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                      (in_stack_fffffffffffffc88,
                       CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                      (in_stack_fffffffffffffc88,
                       CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
            __a_09._M_current._7_1_ = in_stack_fffffffffffffc87;
            __a_09._M_current._0_7_ = in_stack_fffffffffffffc80;
            std::
            iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                      (__a_09,in_stack_fffffffffffffc78);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                      (in_stack_fffffffffffffc88,
                       CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                      (in_stack_fffffffffffffc88,
                       CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
            __a_10._M_current._7_1_ = in_stack_fffffffffffffc87;
            __a_10._M_current._0_7_ = in_stack_fffffffffffffc80;
            std::
            iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                      (__a_10,in_stack_fffffffffffffc78);
          }
        }
      }
      else if ((((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
              (bVar1 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                                 (local_8._M_current,pVar6.first._M_current._M_current), bVar1)) {
        _Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator+(in_stack_fffffffffffffc88,
                          CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
        bVar1 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                          (_Var4._M_current,local_10);
        if (bVar1) {
          return;
        }
      }
      Runtime::
      silent_async<tf::detail::parallel_pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,true>(tf::Runtime&,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,int,bool)::_lambda()_1_>
                ((Runtime *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (anon_class_64_6_4db4d30f *)in_stack_fffffffffffffc78._M_current);
      local_8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator+(in_stack_fffffffffffffc88,
                          CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
      local_25 = 0;
    }
    else {
      partition_left<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                (local_8._M_current,local_10);
      local_8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator+(in_stack_fffffffffffffc88,
                          CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
    }
  }
  local_78 = local_8._M_current;
  local_80 = local_10;
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
            (local_8._M_current,local_10);
  return;
}

Assistant:

void parallel_pdqsort(
  Runtime& rt,
  Iter begin, Iter end, Compare comp,
  int bad_allowed, bool leftmost = true
) {

  // Partitions below this size are sorted sequentially
  constexpr auto cutoff = parallel_sort_cutoff<Iter>();

  // Partitions below this size are sorted using insertion sort
  constexpr auto insertion_sort_threshold = 24;

  // Partitions above this size use Tukey's ninther to select the pivot.
  constexpr auto ninther_threshold = 128;

  //using diff_t = typename std::iterator_traits<Iter>::difference_type;

  // Use a while loop for tail recursion elimination.
  while (true) {

    //diff_t size = end - begin;
    size_t size = end - begin;

    // Insertion sort is faster for small arrays.
    if (size < insertion_sort_threshold) {
      if (leftmost) {
        insertion_sort(begin, end, comp);
      }
      else {
        unguarded_insertion_sort(begin, end, comp);
      }
      return;
    }

    if(size <= cutoff) {
      std::sort(begin, end, comp);
      return;
    }

    // Choose pivot as median of 3 or pseudomedian of 9.
    //diff_t s2 = size / 2;
    size_t s2 = size >> 1;
    if (size > ninther_threshold) {
      sort3(begin, begin + s2, end - 1, comp);
      sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
      sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
      sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
      std::iter_swap(begin, begin + s2);
    }
    else {
      sort3(begin + s2, begin, end - 1, comp);
    }

    // If *(begin - 1) is the end of the right partition
    // of a previous partition operation, there is no element in [begin, end)
    // that is smaller than *(begin - 1).
    // Then if our pivot compares equal to *(begin - 1) we change strategy,
    // putting equal elements in the left partition,
    // greater elements in the right partition.
    // We do not have to recurse on the left partition,
    // since it's sorted (all equal).
    if (!leftmost && !comp(*(begin - 1), *begin)) {
      begin = partition_left(begin, end, comp) + 1;
      continue;
    }

    // Partition and get results.
    const auto pair = Branchless ? partition_right_branchless(begin, end, comp) :
                                   partition_right(begin, end, comp);
       
    const auto pivot_pos = pair.first;
    const auto already_partitioned = pair.second;

    // Check for a highly unbalanced partition.
    //diff_t l_size = pivot_pos - begin;
    //diff_t r_size = end - (pivot_pos + 1);
    const size_t l_size = pivot_pos - begin;
    const size_t r_size = end - (pivot_pos + 1);
    const bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

    // If we got a highly unbalanced partition we shuffle elements
    // to break many patterns.
    if (highly_unbalanced) {
      // If we had too many bad partitions, switch to heapsort
      // to guarantee O(n log n).
      if (--bad_allowed == 0) {
        std::make_heap(begin, end, comp);
        std::sort_heap(begin, end, comp);
        return;
      }

      if (l_size >= insertion_sort_threshold) {
        std::iter_swap(begin, begin + l_size / 4);
        std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);
        if (l_size > ninther_threshold) {
          std::iter_swap(begin + 1, begin + (l_size / 4 + 1));
          std::iter_swap(begin + 2, begin + (l_size / 4 + 2));
          std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
          std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
        }
      }

      if (r_size >= insertion_sort_threshold) {
        std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
        std::iter_swap(end - 1,                   end - r_size / 4);
        if (r_size > ninther_threshold) {
          std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
          std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
          std::iter_swap(end - 2,             end - (1 + r_size / 4));
          std::iter_swap(end - 3,             end - (2 + r_size / 4));
        }
      }
    }
    // decently balanced
    else {
      // sequence try to use insertion sort.
      if (already_partitioned &&
          partial_insertion_sort(begin, pivot_pos, comp) &&
          partial_insertion_sort(pivot_pos + 1, end, comp)
      ) {
        return;
      }
    }

    // Sort the left partition first using recursion and
    // do tail recursion elimination for the right-hand partition.
    // here we need to copy runtime so it stays alive during the sort recursion
    rt.silent_async([=] () mutable {
      parallel_pdqsort<Iter, Compare, Branchless>(
        rt, begin, pivot_pos, comp, bad_allowed, leftmost
      );
    });
    begin = pivot_pos + 1;
    leftmost = false;
  }
}